

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O0

QString * __thiscall
QTranslatorPrivate::do_translate
          (QTranslatorPrivate *this,char *context,char *sourceText,char *comment,int n)

{
  bool bVar1;
  quint16 qVar2;
  uint uVar3;
  quint32 qVar4;
  quint32 qVar5;
  ulong uVar6;
  uchar *context_00;
  uchar *puVar7;
  uchar *puVar8;
  pointer pQVar9;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  QString *in_RDI;
  char *in_R8;
  uint in_R9D;
  long in_FS_OFFSET;
  unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *translator;
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  *__range1;
  quint32 ro;
  quint32 rh;
  uint hash;
  uchar *middle;
  uchar *end;
  uchar *start;
  quint8 len;
  uint contextLen;
  quint16 off;
  uchar *c;
  uint g;
  quint16 hTableSize;
  size_t numItems;
  uint numerus;
  QString *tn;
  const_iterator __end1;
  const_iterator __begin1;
  quint32 h;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined1 *puVar10;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  quint32 in_stack_ffffffffffffff6c;
  uchar *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  quint8 in_stack_ffffffffffffff8f;
  uint in_stack_ffffffffffffffa0;
  uint local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  __normal_iterator<const_std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_*,_std::vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>_>
  local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_38 = "";
  }
  local_40 = in_RCX;
  if (in_RCX == (char *)0x0) {
    local_40 = "";
  }
  local_48 = in_R8;
  if (in_R8 == (char *)0x0) {
    local_48 = "";
  }
  local_50 = 0;
  if (*(int *)(in_RSI + 0xd4) != 0) {
    if (*(int *)(in_RSI + 0xd8) != 0) {
      qVar2 = read16((uchar *)0x430dd1);
      uVar3 = elfHash((char *)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffffa0 = uVar3 % (uint)qVar2;
      qVar2 = read16((uchar *)0x430e2c);
      if (qVar2 == 0) {
        QString::QString((QString *)0x430e5f);
        goto LAB_0043144e;
      }
      strlen(local_38);
      do {
        in_stack_ffffffffffffff8f = read8((uchar *)0x430ec7);
        if (in_stack_ffffffffffffff8f == '\0') {
          QString::QString((QString *)0x430ee5);
          goto LAB_0043144e;
        }
        bVar1 = ::match((uchar *)CONCAT17(in_stack_ffffffffffffff17,
                                          CONCAT16(in_stack_ffffffffffffff16,
                                                   in_stack_ffffffffffffff10)),
                        (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                        (char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      } while (!bVar1);
    }
    uVar6 = (ulong)(*(uint *)(in_RSI + 0xd4) >> 3);
    if (uVar6 != 0) {
      if (-1 < (int)in_R9D) {
        local_50 = numerusHelper(in_R9D,*(uchar **)(in_RSI + 200),*(uint *)(in_RSI + 0xdc));
      }
      do {
        local_c = 0;
        elfHash_continue(local_40,&local_c);
        elfHash_continue(local_48,&local_c);
        elfHash_finish(&local_c);
        puVar7 = *(uchar **)(in_RSI + 0xb8);
        context_00 = puVar7 + (uVar6 - 1) * 8;
        while (puVar8 = puVar7, puVar7 <= context_00) {
          in_stack_ffffffffffffff70 = puVar7 + ((long)context_00 - (long)puVar7 >> 4) * 8;
          in_stack_ffffffffffffff6c = read32((uchar *)0x431057);
          puVar8 = in_stack_ffffffffffffff70;
          if (local_c == in_stack_ffffffffffffff6c) break;
          if (in_stack_ffffffffffffff6c < local_c) {
            puVar7 = in_stack_ffffffffffffff70 + 8;
          }
          else {
            context_00 = in_stack_ffffffffffffff70 + -8;
          }
        }
        if (puVar8 <= context_00) {
          while( true ) {
            bVar1 = false;
            if (puVar8 != *(uchar **)(in_RSI + 0xb8)) {
              qVar4 = read32((uchar *)0x4310f0);
              qVar5 = read32((uchar *)0x431105);
              bVar1 = qVar4 == qVar5;
            }
            if (!bVar1) break;
            puVar8 = puVar8 + -8;
          }
          while (puVar8 < (uchar *)(*(long *)(in_RSI + 0xb8) + (ulong)*(uint *)(in_RSI + 0xd4))) {
            qVar4 = read32((uchar *)0x431169);
            puVar8 = puVar8 + 4;
            if (qVar4 != local_c) break;
            read32((uchar *)0x4311a0);
            puVar8 = puVar8 + 4;
            (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffef8 = local_50;
            getMessage((uchar *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),puVar8
                       ,(char *)context_00,(char *)in_stack_ffffffffffffff70,
                       (char *)CONCAT44(in_stack_ffffffffffffff6c,qVar4),in_stack_ffffffffffffffa0);
            bVar1 = QString::isNull((QString *)0x431230);
            if (!bVar1) goto LAB_0043144e;
            QString::~QString((QString *)0x431289);
          }
        }
        if (*local_48 == '\0') break;
        local_48 = "";
      } while( true );
    }
  }
  local_18._M_current =
       (unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_18._M_current =
       (unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)
       std::
       vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
       ::begin(in_stack_ffffffffffffff00);
  std::
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  ::end(in_stack_ffffffffffffff00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_*,_std::vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<const_std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_*,_std::vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)), bVar1
        ) {
    puVar10 = &DAT_aaaaaaaaaaaaaaaa;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_*,_std::vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>_>
    ::operator*(&local_18);
    (in_RDI->d).size = (qsizetype)puVar10;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>::operator->
                       ((unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)0x431393);
    (*(pQVar9->super_QObject)._vptr_QObject[0xc])
              (in_RDI,pQVar9,local_38,local_40,local_48,(ulong)in_R9D);
    bVar1 = QString::isNull((QString *)0x4313ce);
    if (!bVar1) goto LAB_0043144e;
    QString::~QString((QString *)0x431424);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_*,_std::vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>_>
    ::operator++(&local_18);
  }
  QString::QString((QString *)0x43144e);
LAB_0043144e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QTranslatorPrivate::do_translate(const char *context, const char *sourceText,
                                         const char *comment, int n) const
{
    if (context == nullptr)
        context = "";
    if (sourceText == nullptr)
        sourceText = "";
    if (comment == nullptr)
        comment = "";

    uint numerus = 0;
    size_t numItems = 0;

    if (!offsetLength)
        goto searchDependencies;

    /*
        Check if the context belongs to this QTranslator. If many
        translators are installed, this step is necessary.
    */
    if (contextLength) {
        quint16 hTableSize = read16(contextArray);
        uint g = elfHash(context) % hTableSize;
        const uchar *c = contextArray + 2 + (g << 1);
        quint16 off = read16(c);
        c += 2;
        if (off == 0)
            return QString();
        c = contextArray + (2 + (hTableSize << 1) + (off << 1));

        const uint contextLen = uint(strlen(context));
        for (;;) {
            quint8 len = read8(c++);
            if (len == 0)
                return QString();
            if (match(c, len, context, contextLen))
                break;
            c += len;
        }
    }

    numItems = offsetLength / (2 * sizeof(quint32));
    if (!numItems)
        goto searchDependencies;

    if (n >= 0)
        numerus = numerusHelper(n, numerusRulesArray, numerusRulesLength);

    for (;;) {
        quint32 h = 0;
        elfHash_continue(sourceText, h);
        elfHash_continue(comment, h);
        elfHash_finish(h);

        const uchar *start = offsetArray;
        const uchar *end = start + ((numItems - 1) << 3);
        while (start <= end) {
            const uchar *middle = start + (((end - start) >> 4) << 3);
            uint hash = read32(middle);
            if (h == hash) {
                start = middle;
                break;
            } else if (hash < h) {
                start = middle + 8;
            } else {
                end = middle - 8;
            }
        }

        if (start <= end) {
            // go back on equal key
            while (start != offsetArray && read32(start) == read32(start - 8))
                start -= 8;

            while (start < offsetArray + offsetLength) {
                quint32 rh = read32(start);
                start += 4;
                if (rh != h)
                    break;
                quint32 ro = read32(start);
                start += 4;
                QString tn = getMessage(messageArray + ro, messageArray + messageLength, context,
                                        sourceText, comment, numerus);
                if (!tn.isNull())
                    return tn;
            }
        }
        if (!comment[0])
            break;
        comment = "";
    }

searchDependencies:
    for (const auto &translator : subTranslators) {
        QString tn = translator->translate(context, sourceText, comment, n);
        if (!tn.isNull())
            return tn;
    }
    return QString();
}